

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O2

int Sim_UtilCountPairsOnePrint(Extra_BitMat_t *pMat,Vec_Int_t *vSupport)

{
  uint i;
  uint k;
  int iVar1;
  int i_00;
  int i_01;
  
  iVar1 = vSupport->nSize;
  i_00 = 0;
  while (i_00 < iVar1) {
    i = Vec_IntEntry(vSupport,i_00);
    i_00 = i_00 + 1;
    for (i_01 = i_00; iVar1 = vSupport->nSize, i_01 < iVar1; i_01 = i_01 + 1) {
      k = Vec_IntEntry(vSupport,i_01);
      iVar1 = Extra_BitMatrixLookup1(pMat,i,k);
      if (iVar1 != 0) {
        printf("(%d,%d) ",(ulong)i,(ulong)k);
      }
    }
  }
  return 0;
}

Assistant:

int Sim_UtilCountPairsOnePrint( Extra_BitMat_t * pMat, Vec_Int_t * vSupport )
{
    int i, k, Index1, Index2;
    Vec_IntForEachEntry( vSupport, i, Index1 )
    Vec_IntForEachEntryStart( vSupport, k, Index2, Index1+1 )
        if ( Extra_BitMatrixLookup1( pMat, i, k ) )
            printf( "(%d,%d) ", i, k );
    return 0;
}